

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O0

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true>
duckdb::SetNotNullInfo::Deserialize(Deserializer *deserializer)

{
  unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> *in_RSI;
  __uniq_ptr_impl<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_> in_RDI;
  Deserializer *unaff_retaddr;
  unique_ptr<duckdb::SetNotNullInfo,_std::default_delete<duckdb::SetNotNullInfo>,_true> result;
  pointer pSVar1;
  SetNotNullInfo *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> *tag;
  __uniq_ptr_impl<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_> _Var2;
  field_id_t field_id;
  
  _Var2._M_t.
  super__Tuple_impl<0UL,_duckdb::AlterTableInfo_*,_std::default_delete<duckdb::AlterTableInfo>_>.
  super__Head_base<0UL,_duckdb::AlterTableInfo_*,_false>._M_head_impl =
       in_RDI._M_t.
       super__Tuple_impl<0UL,_duckdb::AlterTableInfo_*,_std::default_delete<duckdb::AlterTableInfo>_>
       .super__Head_base<0UL,_duckdb::AlterTableInfo_*,_false>._M_head_impl;
  operator_new(0x98);
  field_id = _Var2._M_t.
             super__Tuple_impl<0UL,_duckdb::AlterTableInfo_*,_std::default_delete<duckdb::AlterTableInfo>_>
             .super__Head_base<0UL,_duckdb::AlterTableInfo_*,_false>._M_head_impl._6_2_;
  SetNotNullInfo(in_stack_ffffffffffffffb0);
  pSVar1 = (pointer)&stack0xffffffffffffffe8;
  unique_ptr<duckdb::SetNotNullInfo,std::default_delete<duckdb::SetNotNullInfo>,true>::
  unique_ptr<std::default_delete<duckdb::SetNotNullInfo>,void>
            ((unique_ptr<duckdb::SetNotNullInfo,_std::default_delete<duckdb::SetNotNullInfo>,_true>
              *)in_stack_ffffffffffffffb0,pSVar1);
  tag = in_RSI;
  unique_ptr<duckdb::SetNotNullInfo,_std::default_delete<duckdb::SetNotNullInfo>,_true>::operator->
            ((unique_ptr<duckdb::SetNotNullInfo,_std::default_delete<duckdb::SetNotNullInfo>,_true>
              *)in_RSI);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (unaff_retaddr,field_id,(char *)tag,in_stack_ffffffffffffffe8);
  unique_ptr<duckdb::AlterTableInfo,std::default_delete<duckdb::AlterTableInfo>,true>::
  unique_ptr<duckdb::SetNotNullInfo,std::default_delete<std::unique_ptr<duckdb::AlterTableInfo,std::default_delete<duckdb::AlterTableInfo>>>,void>
            (in_RSI,(unique_ptr<duckdb::SetNotNullInfo,_std::default_delete<duckdb::SetNotNullInfo>_>
                     *)pSVar1);
  unique_ptr<duckdb::SetNotNullInfo,_std::default_delete<duckdb::SetNotNullInfo>,_true>::~unique_ptr
            ((unique_ptr<duckdb::SetNotNullInfo,_std::default_delete<duckdb::SetNotNullInfo>,_true>
              *)0xae432e);
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (_Tuple_impl<0UL,_duckdb::AlterTableInfo_*,_std::default_delete<duckdb::AlterTableInfo>_>)
         in_RDI._M_t.
         super__Tuple_impl<0UL,_duckdb::AlterTableInfo_*,_std::default_delete<duckdb::AlterTableInfo>_>
         .super__Head_base<0UL,_duckdb::AlterTableInfo_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<AlterTableInfo> SetNotNullInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<SetNotNullInfo>(new SetNotNullInfo());
	deserializer.ReadPropertyWithDefault<string>(400, "column_name", result->column_name);
	return std::move(result);
}